

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::String> * __thiscall
kj::anon_unknown_8::DiskHandle::createNamedTemporary
          (Maybe<kj::String> *__return_storage_ptr__,DiskHandle *this,PathPtr finalName,
          WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  Disposer *pDVar1;
  PathPtr finalName_00;
  size_t sVar2;
  Fault FVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  Maybe<kj::String> *pMVar7;
  undefined4 extraout_var;
  Maybe<kj::String> *extraout_RAX;
  Maybe<kj::String> *extraout_RAX_00;
  Exception *pEVar8;
  Iface *pIVar9;
  Function<int_(kj::StringPtr)> *tryCreate_00;
  PathPtr PVar10;
  String pathPrefix;
  Fault f_1;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar11;
  undefined1 uVar12;
  PathPtr local_b8;
  String local_a8;
  Fault local_88;
  size_t sStack_80;
  Maybe<kj::String> *local_78;
  DiskHandle *local_70;
  Function<int_(kj::StringPtr)> local_68;
  Function<int_(kj::StringPtr)> local_58;
  ArrayPtr<const_kj::String> local_40;
  
  pcVar6 = (char *)finalName.parts.size_;
  local_b8.parts.ptr = finalName.parts.ptr;
  local_b8.parts.size_ = (size_t)pcVar6;
  local_70 = this;
  if (pcVar6 == (char *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x370,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::~Fault(&local_88);
    (__return_storage_ptr__->ptr).isSet = false;
    return extraout_RAX;
  }
  if ((anonymous_namespace)::DiskHandle::
      createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)::pid == '\0')
  {
    (anonymous_namespace)::DiskHandle::createNamedTemporary();
  }
  local_88.exception = (Exception *)0x0;
  sStack_80 = 0;
  local_78 = (Maybe<kj::String> *)0x0;
  if ((char *)0x1 < local_b8.parts.size_) {
    local_40 = (ArrayPtr<const_kj::String>)PathPtr::parent(&local_b8);
    str<kj::PathPtr,char>(&local_a8,(kj *)&local_40,(PathPtr *)&stack0xffffffffffffff46,pcVar6);
    sVar2 = sStack_80;
    this = (DiskHandle *)local_88.exception;
    if (local_88.exception != (Exception *)0x0) {
      local_88.exception = (Exception *)0x0;
      sStack_80 = 0;
      (*(code *)**(undefined8 **)&local_78->ptr)(local_78,this,1,sVar2,sVar2,0);
    }
    local_88.exception = (Exception *)local_a8.content.ptr;
    sStack_80 = local_a8.content.size_;
    local_78 = (Maybe<kj::String> *)local_a8.content.disposer;
  }
  uVar11 = 0x2e;
  local_40.ptr._0_4_ = createNamedTemporary::counter;
  uVar12 = 0x2e;
  createNamedTemporary::counter = createNamedTemporary::counter + 1;
  pcVar6 = PathPtr::basename(&local_b8,(char *)this);
  str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
            (&local_a8,(kj *)&local_88,(String *)".kj-tmp.",(char (*) [9])&createNamedTemporary::pid
             ,(int *)&stack0xffffffffffffff46,(char *)&local_40,(uint *)&stack0xffffffffffffff47,
             pcVar6,(String *)".partial",
             (char (*) [9])CONCAT17(uVar12,CONCAT16(uVar11,in_stack_ffffffffffffff40)));
  do {
    pEVar8 = (Exception *)0x4f5114;
    if (local_a8.content.size_ != 0) {
      pEVar8 = (Exception *)local_a8.content.ptr;
    }
    pIVar9 = (tryCreate->impl).ptr;
    iVar5 = (**pIVar9->_vptr_Iface)
                      (pIVar9,pEVar8,local_a8.content.size_ + (local_a8.content.size_ == 0));
    if (-1 < iVar5) goto LAB_004a3846;
    iVar5 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 == 0) {
LAB_004a3846:
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.content.ptr = local_a8.content.ptr;
    (__return_storage_ptr__->ptr).field_1.value.content.size_ = local_a8.content.size_;
    (__return_storage_ptr__->ptr).field_1.value.content.disposer = local_a8.content.disposer;
    pMVar7 = (Maybe<kj::String> *)local_a8.content.disposer;
    goto LAB_004a3947;
  }
  if (iVar5 == 2) {
    if (((mode & CREATE_PARENT) != 0) && ((char *)0x1 < local_b8.parts.size_)) {
      PVar10 = PathPtr::parent(&local_b8);
      bVar4 = tryMkdir(local_70,PVar10,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar4) {
        PVar10.parts.size_ = local_b8.parts.size_;
        PVar10.parts.ptr = local_b8.parts.ptr;
        local_68.impl.disposer = (tryCreate->impl).disposer;
        local_68.impl.ptr = (tryCreate->impl).ptr;
        tryCreate_00 = &local_68;
        (tryCreate->impl).ptr = (Iface *)0x0;
        pMVar7 = createNamedTemporary
                           (__return_storage_ptr__,local_70,PVar10,mode & ~CREATE_PARENT,
                            tryCreate_00);
        pIVar9 = local_68.impl.ptr;
        goto LAB_004a37df;
      }
    }
LAB_004a38dd:
    kj::_::Debug::Fault::Fault<int,kj::String&>
              ((Fault *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x38a,iVar5,"create(path)","path",&local_a8);
    kj::_::Debug::Fault::~Fault((Fault *)&local_40);
    (__return_storage_ptr__->ptr).isSet = false;
    pMVar7 = extraout_RAX_00;
  }
  else {
    if (iVar5 != 0x11) goto LAB_004a38dd;
    finalName_00.parts.size_ = local_b8.parts.size_;
    finalName_00.parts.ptr = local_b8.parts.ptr;
    local_58.impl.disposer = (tryCreate->impl).disposer;
    local_58.impl.ptr = (tryCreate->impl).ptr;
    tryCreate_00 = &local_58;
    (tryCreate->impl).ptr = (Iface *)0x0;
    pMVar7 = createNamedTemporary(__return_storage_ptr__,local_70,finalName_00,mode,tryCreate_00);
    pIVar9 = local_58.impl.ptr;
LAB_004a37df:
    if (pIVar9 != (Iface *)0x0) {
      (tryCreate_00->impl).ptr = (Iface *)0x0;
      pDVar1 = (tryCreate_00->impl).disposer;
      iVar5 = (**pDVar1->_vptr_Disposer)
                        (pDVar1,pIVar9->_vptr_Iface[-2] + (long)&pIVar9->_vptr_Iface);
      pMVar7 = (Maybe<kj::String> *)CONCAT44(extraout_var,iVar5);
    }
  }
  sVar2 = local_a8.content.size_;
  pcVar6 = local_a8.content.ptr;
  if ((Exception *)local_a8.content.ptr != (Exception *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    pMVar7 = (Maybe<kj::String> *)
             (*(code *)**(undefined8 **)&(local_a8.content.disposer)->_vptr_ArrayDisposer)
                       (local_a8.content.disposer,pcVar6,1,sVar2,sVar2,0);
  }
LAB_004a3947:
  sVar2 = sStack_80;
  FVar3.exception = local_88.exception;
  if (local_88.exception != (Exception *)0x0) {
    local_88.exception = (Exception *)0x0;
    sStack_80 = 0;
    pMVar7 = (Maybe<kj::String> *)
             (*(code *)**(undefined8 **)&local_78->ptr)(local_78,FVar3.exception,1,sVar2,sVar2,0);
  }
  return pMVar7;
}

Assistant:

kj::Maybe<String> createNamedTemporary(
      PathPtr finalName, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Create a temporary file which will eventually replace `finalName`.
    //
    // Calls `tryCreate` to actually create the temporary, passing in the desired path. tryCreate()
    // is expected to behave like a syscall, returning a negative value and setting `errno` on
    // error. tryCreate() MUST fail with EEXIST if the path exists -- this is not checked in
    // advance, since it needs to be checked atomically. In the case of EEXIST, tryCreate() will
    // be called again with a new path.
    //
    // Returns the temporary path that succeeded. Only returns nullptr if there was an exception
    // but we're compiled with -fno-exceptions.

    if (finalName.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
      return nullptr;
    }

    static uint counter = 0;
    static const pid_t pid = getpid();
    String pathPrefix;
    if (finalName.size() > 1) {
      pathPrefix = kj::str(finalName.parent(), '/');
    }
    auto path = kj::str(pathPrefix, HIDDEN_PREFIX, pid, '.', counter++, '.',
                        finalName.basename()[0], ".partial");

    KJ_SYSCALL_HANDLE_ERRORS(tryCreate(path)) {
      case EEXIST:
        return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && finalName.size() > 1 &&
            tryMkdir(finalName.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                         WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          mode = mode - WriteMode::CREATE_PARENT;
          return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
        }
        // fallthrough
      default:
        KJ_FAIL_SYSCALL("create(path)", error, path) { break; }
        return nullptr;
    }

    return kj::mv(path);
  }